

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pm_matrix_tests.h
# Opt level: O1

void test_maximal_dimension<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<false,(Gudhi::persistence_matrix::Column_types)7,false,true,true,true,true,true>>>
               (Matrix<RU_rep_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_true,_true,_true>_>
                *m)

{
  logic_error *this;
  undefined4 local_120;
  int local_11c;
  undefined4 *local_118;
  int *local_110;
  undefined1 local_108;
  undefined8 local_100;
  shared_count sStack_f8;
  pair<unsigned_int,_unsigned_int> local_f0;
  ulong uStack_e8;
  undefined8 *local_e0;
  int **ppiStack_d8;
  undefined4 local_d0;
  undefined4 uStack_cc;
  undefined4 uStack_c8;
  undefined4 uStack_c4;
  initializer_list<std::pair<unsigned_int,_unsigned_int>_> local_c0;
  undefined8 *local_b0;
  undefined4 **local_a8;
  char *local_a0;
  char *local_98;
  undefined1 *local_90;
  undefined1 *local_88;
  char *local_80;
  char *local_78;
  undefined **local_70;
  undefined1 local_68;
  undefined8 *local_60;
  char *local_58;
  undefined1 *local_50;
  undefined1 *local_48;
  char *local_40;
  char *local_38;
  
  local_40 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_38 = "";
  local_50 = &boost::unit_test::basic_cstring<char_const>::null;
  local_48 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_40,0x39f);
  local_68 = 0;
  local_70 = &PTR__lazy_ostream_0025fdd0;
  local_60 = &boost::unit_test::lazy_ostream::inst;
  local_58 = "";
  local_11c = (m->matrix_).reducedMatrixR_.super_Matrix_dimension_option.maxDim_;
  local_110 = &local_11c;
  local_118 = &local_120;
  local_120 = 2;
  local_108 = local_11c == 2;
  local_100 = 0;
  sStack_f8.pi_ = (sp_counted_base *)0x0;
  local_a0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_98 = "";
  ppiStack_d8 = &local_110;
  uStack_e8 = uStack_e8 & 0xffffffffffffff00;
  local_f0 = (pair<unsigned_int,_unsigned_int>)&PTR__lazy_ostream_0025fd90;
  local_e0 = &boost::unit_test::lazy_ostream::inst;
  local_c0._M_len = local_c0._M_len & 0xffffffffffffff00;
  local_a8 = &local_118;
  local_c0._M_array = (iterator)&PTR__lazy_ostream_0025fd90;
  local_b0 = &boost::unit_test::lazy_ostream::inst;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_f8);
  local_f0.first = 0;
  local_f0.second = 1;
  uStack_e8 = 0x400000001;
  local_e0 = (undefined8 *)0x100000002;
  ppiStack_d8 = (int **)0x400000003;
  local_d0 = 4;
  uStack_cc = 1;
  uStack_c8 = 5;
  uStack_c4 = 4;
  local_c0._M_len = 6;
  local_c0._M_array = &local_f0;
  if ((m->colSettings_->operators).characteristic_ == 0xffffffff) {
    this = (logic_error *)__cxa_allocate_exception(0x10);
    std::logic_error::logic_error
              (this,
               "Matrix::insert_boundary - Columns cannot be initialized if the coefficient field characteristic is not specified."
              );
  }
  else {
    Gudhi::persistence_matrix::
    RU_matrix<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<false,(Gudhi::persistence_matrix::Column_types)7,false,true,true,true,true,true>>>
    ::insert_boundary<std::initializer_list<std::pair<unsigned_int,unsigned_int>>>
              ((RU_matrix<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<false,(Gudhi::persistence_matrix::Column_types)7,false,true,true,true,true,true>>>
                *)&m->matrix_,&local_c0,-1);
    local_f0.first = 0;
    local_f0.second = 1;
    uStack_e8 = 0x400000001;
    local_e0 = (undefined8 *)0x100000002;
    ppiStack_d8 = (int **)0x400000003;
    local_c0._M_len = 4;
    if ((m->colSettings_->operators).characteristic_ != 0xffffffff) {
      local_c0._M_array = &local_f0;
      Gudhi::persistence_matrix::
      RU_matrix<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<false,(Gudhi::persistence_matrix::Column_types)7,false,true,true,true,true,true>>>
      ::insert_boundary<std::initializer_list<std::pair<unsigned_int,unsigned_int>>>
                ((RU_matrix<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<false,(Gudhi::persistence_matrix::Column_types)7,false,true,true,true,true,true>>>
                  *)&m->matrix_,&local_c0,-1);
      local_80 = 
      "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
      ;
      local_78 = "";
      local_90 = &boost::unit_test::basic_cstring<char_const>::null;
      local_88 = &boost::unit_test::basic_cstring<char_const>::null;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_80,0x3a9);
      local_68 = 0;
      local_70 = &PTR__lazy_ostream_0025fdd0;
      local_60 = &boost::unit_test::lazy_ostream::inst;
      local_58 = "";
      local_11c = (m->matrix_).reducedMatrixR_.super_Matrix_dimension_option.maxDim_;
      local_108 = local_11c == 5;
      local_120 = 5;
      local_100 = 0;
      sStack_f8.pi_ = (sp_counted_base *)0x0;
      local_a0 = 
      "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
      ;
      local_98 = "";
      local_110 = &local_11c;
      uStack_e8 = uStack_e8 & 0xffffffffffffff00;
      local_f0 = (pair<unsigned_int,_unsigned_int>)&PTR__lazy_ostream_0025fd90;
      local_e0 = &boost::unit_test::lazy_ostream::inst;
      ppiStack_d8 = &local_110;
      local_118 = &local_120;
      local_c0._M_len = local_c0._M_len & 0xffffffffffffff00;
      local_c0._M_array = (iterator)&PTR__lazy_ostream_0025fd90;
      local_b0 = &boost::unit_test::lazy_ostream::inst;
      local_a8 = &local_118;
      boost::test_tools::tt_detail::report_assertion();
      boost::detail::shared_count::~shared_count(&sStack_f8);
      return;
    }
    local_c0._M_array = &local_f0;
    this = (logic_error *)__cxa_allocate_exception(0x10);
    std::logic_error::logic_error
              (this,
               "Matrix::insert_boundary - Columns cannot be initialized if the coefficient field characteristic is not specified."
              );
  }
  __cxa_throw(this,&std::logic_error::typeinfo,std::logic_error::~logic_error);
}

Assistant:

void test_maximal_dimension(Matrix& m) {
  BOOST_CHECK_EQUAL(m.get_max_dimension(), 2);

  if constexpr (Matrix::Option_list::is_z2) {
    m.insert_boundary({0, 1, 2, 3, 4, 5});
    m.insert_boundary({0, 1, 2, 3});
  } else {
    m.insert_boundary({{0, 1}, {1, 4}, {2, 1}, {3, 4}, {4, 1}, {5, 4}});
    m.insert_boundary({{0, 1}, {1, 4}, {2, 1}, {3, 4}});
  }

  BOOST_CHECK_EQUAL(m.get_max_dimension(), 5);

  if constexpr (Matrix::Option_list::has_vine_update &&
                (Matrix::Option_list::is_of_boundary_type ||
                 (Matrix::Option_list::has_map_column_container && Matrix::Option_list::has_column_pairings))) {
    m.remove_maximal_cell(7);
    BOOST_CHECK_EQUAL(m.get_max_dimension(), 3);
  }
}